

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

int __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  in_critical_section<unsigned_char> *piVar1;
  byte bVar2;
  ulong uVar3;
  char cVar4;
  int extraout_EAX;
  long in_RCX;
  long lVar5;
  long in_RDX;
  uint in_R8D;
  undefined1 local_18 [8];
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  
  uVar3 = *(ulong *)(in_RCX + 8);
  *(undefined8 *)(in_RCX + 8) = 0;
  lVar5 = 0;
  do {
    (this->child_indexes)._M_elems[*(byte *)(in_RDX + 0x30 + lVar5)].value.
    super___atomic_base<unsigned_char>._M_i = (__int_type_conflict2)lVar5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&this->children + lVar5 * 8) = *(undefined8 *)(in_RDX + 0x40 + lVar5 * 8);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  bVar2 = *(byte *)(uVar3 + 0x20 + (ulong)in_R8D);
  local_18 = (undefined1  [8])ctx;
  if ((this->child_indexes)._M_elems[bVar2].value.super___atomic_base<unsigned_char>._M_i == 0xff) {
    (this->child_indexes)._M_elems[bVar2].value.super___atomic_base<unsigned_char>._M_i = '\x10';
    if ((uVar3 & 7) == 0) {
      (this->children).pointer_vector[4][0] = uVar3;
      if ((byte)this->field_0x20 < 0x30) {
        lVar5 = (ulong)(byte)this->field_0x20 + 0x28;
        do {
          piVar1 = (this->child_indexes)._M_elems + lVar5 * 8 + -0x21;
          piVar1->value = (atomic<unsigned_char>)0x0;
          piVar1[1] = (atomic<unsigned_char>)0x0;
          piVar1[2] = (atomic<unsigned_char>)0x0;
          piVar1[3] = (atomic<unsigned_char>)0x0;
          piVar1[4] = (atomic<unsigned_char>)0x0;
          piVar1[5] = (atomic<unsigned_char>)0x0;
          piVar1[6] = (atomic<unsigned_char>)0x0;
          piVar1[7] = (atomic<unsigned_char>)0x0;
          cVar4 = (char)lVar5;
          lVar5 = lVar5 + 1;
        } while (cVar4 != 'W');
      }
      std::
      unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)local_18);
      return extraout_EAX;
    }
    __assert_fail("(result & ptr_bit_mask) == uintptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                  ,0x182,
                  "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                 );
  }
  __assert_fail("child_indexes[key_byte] == empty_child",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x86e,
                "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(db_type &, inode16_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode16_type &__restrict source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode16_type>(
            &source_node, db_instance)};
    auto *const __restrict child_ptr = child.release();

    // TODO(laurynas): consider AVX512 scatter?
    std::uint8_t i = 0;
    for (; i < inode16_type::capacity; ++i) {
      const auto existing_key_byte = source_node.keys.byte_array[i].load();
      child_indexes[static_cast<std::uint8_t>(existing_key_byte)] = i;
    }
    for (i = 0; i < inode16_type::capacity; ++i) {
      children.pointer_array[i] = source_node.children[i];
    }

    const auto key_byte =
        static_cast<std::uint8_t>(child_ptr->get_key_view()[depth]);

    UNODB_DETAIL_ASSERT(child_indexes[key_byte] == empty_child);
    UNODB_DETAIL_ASSUME(i == inode16_type::capacity);

    child_indexes[key_byte] = i;
    children.pointer_array[i] = node_ptr{child_ptr, node_type::LEAF};
    for (i = this->children_count; i < basic_inode_48::capacity; i++) {
      children.pointer_array[i] = node_ptr{nullptr};
    }
  }